

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.hpp
# Opt level: O3

void __thiscall
boost::xpressive::
compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>::
get_name_<char_const*>
          (compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
           *this,char **begin,char *end,string_type *name)

{
  byte *pbVar1;
  undefined **local_60 [2];
  undefined **local_50;
  refcount_ptr<boost::exception_detail::error_info_container> local_48;
  char *local_40;
  char *local_38;
  undefined8 local_30;
  error_type local_28;
  
  eat_ws_<char_const*>(this,begin,end);
  name->_M_string_length = 0;
  *(name->_M_dataplus)._M_p = '\0';
  pbVar1 = (byte *)*begin;
  while (((pbVar1 != (byte *)end && (*(ushort *)(this + 0x216) != 0)) &&
         ((*(ushort *)(this + (ulong)*pbVar1 * 2) & *(ushort *)(this + 0x216)) != 0))) {
    std::__cxx11::string::push_back((char)name);
    pbVar1 = (byte *)(*begin + 1);
    *begin = (char *)pbVar1;
  }
  eat_ws_<char_const*>(this,begin,end);
  if (name->_M_string_length != 0) {
    return;
  }
  std::runtime_error::runtime_error((runtime_error *)local_60,"incomplete extension");
  local_48.px_ = (error_info_container *)0x0;
  local_60[0] = &PTR__regex_error_00193398;
  local_50 = &PTR__regex_error_001933c0;
  local_28 = error_paren;
  local_40 = 
  "void boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::get_name_(FwdIter &, FwdIter, string_type &) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
  ;
  local_38 = 
  "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O3/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
  ;
  local_30._0_4_ = 0x1b9;
  local_30._4_4_ = -1;
  throw_exception<boost::xpressive::regex_error>((regex_error *)local_60);
}

Assistant:

void get_name_(FwdIter &begin, FwdIter end, string_type &name)
    {
        this->eat_ws_(begin, end);
        for(name.clear(); begin != end && this->is_alnum_(*begin); ++begin)
        {
            name.push_back(*begin);
        }
        this->eat_ws_(begin, end);
        BOOST_XPR_ENSURE_(!name.empty(), regex_constants::error_paren, "incomplete extension");
    }